

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O2

void Style::extractConditionalConstraint(TempConstraintData *tempConstraint,xml_node<char> *node)

{
  Quant QVar1;
  bool bVar2;
  int iVar3;
  xml_node<char> *this;
  xml_node<char> *this_00;
  logic_error *plVar4;
  char *pcVar5;
  allocator<char> local_d5;
  Quant local_d4;
  reference local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  string attrVal;
  string local_70;
  u16string local_50;
  
  pcVar5 = (node->super_xml_base<char>).m_name;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  iVar3 = strcmp(pcVar5,"bcf:constraint");
  if (iVar3 == 0) {
    attrVal._M_dataplus._M_p._0_4_ = 0;
    attrVal._M_string_length = 0;
    attrVal.field_2._M_allocated_capacity._0_4_ = 0;
    attrVal.field_2._M_allocated_capacity._4_4_ = 0;
    attrVal.field_2._8_4_ = 0;
    stack0xffffffffffffff6c = 0;
    local_d0 = std::
               vector<Style::ConditionalConstraint,_std::allocator<Style::ConditionalConstraint>_>::
               emplace_back<Style::ConditionalConstraint>
                         (&tempConstraint->conditional,(ConditionalConstraint *)&attrVal);
    ConditionalConstraint::~ConditionalConstraint((ConditionalConstraint *)&attrVal);
    this_00 = node->m_first_node;
    do {
      if (this_00 == (xml_node<char> *)0x0) {
        return;
      }
      pcVar5 = (this_00->m_first_attribute->super_xml_base<char>).m_value;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&attrVal,pcVar5,(allocator<char> *)&local_50);
      bVar2 = std::operator==(&attrVal,"all");
      QVar1 = All;
      if (!bVar2) {
        bVar2 = std::operator==(&attrVal,"one");
        QVar1 = One;
        if (!bVar2) {
          bVar2 = std::operator==(&attrVal,"none");
          QVar1 = None;
          if (!bVar2) {
            plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar4,"Unexpected result");
            __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
      }
      local_d4 = QVar1;
      local_c8 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      for (this = this_00->m_first_node; this != (xml_node<char> *)0x0;
          this = rapidxml::xml_node<char>::next_sibling(this,(char *)0x0,0,true)) {
        pcVar5 = (this->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar5,&local_d5);
        UtfHandler::utf8to16(&local_50,(UtfHandler *)(anonymous_namespace)::utf,&local_70);
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string>
                  ((vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                   &local_c8,&local_50);
        std::__cxx11::u16string::~u16string((u16string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      pcVar5 = (this_00->super_xml_base<char>).m_name;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      iVar3 = strcmp(pcVar5 + 4,"antecedent");
      (&local_d0->pre)[iVar3 != 0].condition = local_d4;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::operator=(&(&local_d0->pre)[iVar3 != 0].fields,
                  (vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                   *)&local_c8);
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                 *)&local_c8);
      std::__cxx11::string::~string((string *)&attrVal);
      this_00 = rapidxml::xml_node<char>::next_sibling(this_00,(char *)0x0,0,true);
    } while( true );
  }
  plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar4,"Unexpected node name");
  __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void extractConditionalConstraint (TempConstraintData &tempConstraint, xml_node<> *node) {
    EXPECT_NAME(node, "bcf:constraint");
    ConditionalConstraint &conditional = tempConstraint.conditional.emplace_back(ConditionalConstraint {});

    for (xml_node<> *child = node->first_node(); child; child = child->next_sibling()) {
        string attrVal = child->first_attribute()->value(); // TODO: Check and don't segfault on this

        ConditionalConstraint::Quant quant;

        if (attrVal == "all") {
            quant = ConditionalConstraint::Quant::All;
        } else if (attrVal == "one") {
            quant = ConditionalConstraint::Quant::One;
        } else {
            ASSERT(attrVal == "none");
            quant = ConditionalConstraint::Quant::None;
        }

        vector<u16string> fields {};

        for (xml_node<> *field = child->first_node(); field; field = field->next_sibling()) {
            fields.emplace_back(utf.utf8to16(field->value()));
        }

        const char *name = child->name();
        if (IS("antecedent")) {
            conditional.pre.condition = quant;
            conditional.pre.fields = fields;
        } else {
            conditional.post.condition = quant;
            conditional.post.fields = fields;
        }
    }
}